

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UdpSocket.cpp
# Opt level: O1

void __thiscall Liby::UdpSocket::handleConnectEvent(UdpSocket *this,Endpoint *ep)

{
  iterator iVar1;
  shared_ptr<Liby::UdpConnection> uconn;
  undefined1 local_51;
  UdpConnection *local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  pair<Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_> local_40;
  
  iVar1 = std::
          _Rb_tree<Liby::Endpoint,_std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>,_std::_Select1st<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>,_std::less<Liby::Endpoint>,_std::allocator<std::pair<const_Liby::Endpoint,_std::shared_ptr<Liby::UdpConnection>_>_>_>
          ::find(&(this->conns_)._M_t,ep);
  if ((_Rb_tree_header *)iVar1._M_node == &(this->conns_)._M_t._M_impl.super__Rb_tree_header) {
    local_40.first = (Endpoint)this;
    std::__shared_ptr<Liby::UdpConnection,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<std::allocator<Liby::UdpConnection>,Liby::UdpSocket*,Liby::Endpoint_const&>
              ((__shared_ptr<Liby::UdpConnection,(__gnu_cxx::_Lock_policy)2> *)&local_50,
               (allocator<Liby::UdpConnection> *)&local_51,(UdpSocket **)&local_40,ep);
    local_40.first = *ep;
    local_40.second.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         local_50;
    local_40.second.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = local_48;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_48->_M_use_count = local_48->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_48->_M_use_count = local_48->_M_use_count + 1;
      }
    }
    std::
    _Rb_tree<Liby::Endpoint,std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>,std::_Select1st<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
    ::_M_emplace_unique<std::pair<Liby::Endpoint,std::shared_ptr<Liby::UdpConnection>>>
              ((_Rb_tree<Liby::Endpoint,std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>,std::_Select1st<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>,std::less<Liby::Endpoint>,std::allocator<std::pair<Liby::Endpoint_const,std::shared_ptr<Liby::UdpConnection>>>>
                *)&this->conns_,&local_40);
    if (local_40.second.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_40.second.super___shared_ptr<Liby::UdpConnection,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    if ((this->connectorCallback_).super__Function_base._M_manager != (_Manager_type)0x0) {
      (*(this->connectorCallback_)._M_invoker)((_Any_data *)&this->connectorCallback_,local_50);
    }
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return;
}

Assistant:

void UdpSocket::handleConnectEvent(const Endpoint &ep) {
    auto it = conns_.find(ep);
    if (it != conns_.end())
        return;

    auto uconn = std::make_shared<UdpConnection>(this, ep);
    conns_.insert(std::make_pair(ep, uconn));
    if (connectorCallback_) {
        connectorCallback_(*uconn);
    }
}